

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_boost_suite.cpp
# Opt level: O1

void optional_suite::test_value(void)

{
  value_type input [3];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  iarchive in;
  uchar local_d4 [4];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  iarchive local_a8;
  
  local_d4[2] = 'A';
  local_d4[0] = 0xa9;
  local_d4[1] = '\x01';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>(&local_a8,(uchar (*) [3])local_d4)
  ;
  local_d0.super_type.m_initialized = false;
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::load(&local_a8,&local_d0,0);
  boost::detail::test_impl
            ("value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
             ,0x20,"void optional_suite::test_value()",local_d0.super_type.m_initialized);
  if (local_d0.super_type.m_initialized != false) {
    boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
              ("*value","\"A\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
               ,0x21,"void optional_suite::test_value()",&local_d0.super_type.m_storage,"A");
    if (local_d0.super_type.m_initialized == true) {
      if (local_d0.super_type.m_storage.dummy_.aligner_ !=
          (type)((long)&local_d0.super_type.m_storage.dummy_ + 0x10)) {
        operator_delete((void *)local_d0.super_type.m_storage.dummy_.aligner_,
                        local_d0.super_type.m_storage.dummy_._16_8_ + 1);
      }
      local_d0.super_type.m_initialized = false;
    }
    local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_00109c50;
    std::
    _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
    ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                    *)((long)&local_a8 + 0x50));
    boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
    return;
  }
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                "reference_type boost::optional<std::basic_string<char>>::get() [T = std::basic_string<char>]"
               );
}

Assistant:

void test_value()
{
    const value_type input[] = { token::code::string8, 0x01, 'A' };
    format::iarchive in(input);
    boost::optional<std::string> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value);
    TRIAL_PROTOCOL_TEST_EQUAL(*value, "A");
}